

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdeclnode.cpp
# Opt level: O0

void __thiscall
FuncDeclNode::check(FuncDeclNode *this,
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                   *tables)

{
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *pvVar1;
  bool bVar2;
  size_type sVar3;
  map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
  *pmVar4;
  pointer pTVar5;
  pointer pAVar6;
  SemanticException *pSVar7;
  pointer pAVar8;
  pointer pSVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>,_bool>
  pVar10;
  allocator local_409;
  string local_408;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  SymbolInfo local_3a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_340;
  undefined1 local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  reference local_278;
  unique_ptr<ArgNode,_std::default_delete<ArgNode>_> *a;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
  *__range1;
  _Rb_tree_node_base _Stack_250;
  size_t sStack_230;
  _Base_ptr local_228;
  undefined1 local_220;
  string local_218;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  SymbolInfo local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
  local_150;
  undefined1 local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [8];
  string funcScope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *local_18;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
  *tables_local;
  FuncDeclNode *this_local;
  
  local_18 = tables;
  tables_local = (vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                  *)this;
  bVar2 = wasDeclared(tables,&this->name);
  if (bVar2) {
    funcScope.field_2._M_local_buf[0xb] = '\x01';
    pSVar7 = (SemanticException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_58,"error: multiple definition of function \'",&this->name);
    std::operator+(&local_38,&local_58,"\'");
    SemanticException::SemanticException(pSVar7,&local_38);
    funcScope.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(pSVar7,&SemanticException::typeinfo,SemanticException::~SemanticException);
  }
  std::__cxx11::string::string(local_88);
  sVar3 = std::
          vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
          ::size(local_18);
  if (sVar3 == 1) {
    std::__cxx11::string::operator=(local_88,"global");
    pmVar4 = (map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
              *)std::
                vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                ::back(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"func",&local_1d1);
    pTVar5 = std::unique_ptr<TypeNode,_std::default_delete<TypeNode>_>::operator->
                       (&this->returnType);
    std::__cxx11::string::string((string *)&local_1f8,(string *)&pTVar5->name);
    std::__cxx11::string::string((string *)&local_218,local_88);
    SymbolInfo::SymbolInfo(&local_1b0,&local_1d0,&local_1f8,&local_218);
    std::make_pair<std::__cxx11::string&,SymbolInfo>(&local_150,&this->name,&local_1b0);
    pVar10 = std::
             map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
             ::emplace<std::pair<std::__cxx11::string,SymbolInfo>>(pmVar4,&local_150);
    local_228 = (_Base_ptr)pVar10.first._M_node;
    local_220 = pVar10.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
    ::~pair(&local_150);
    SymbolInfo::~SymbolInfo(&local_1b0);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_88);
    pvVar1 = local_18;
    _Stack_250._M_right = (_Base_ptr)0x0;
    sStack_230 = 0;
    _Stack_250._M_parent = (_Base_ptr)0x0;
    _Stack_250._M_left = (_Base_ptr)0x0;
    __range1 = (vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
                *)0x0;
    _Stack_250._M_color = _S_red;
    _Stack_250._4_4_ = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
           *)&__range1);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
    ::push_back(pvVar1,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
                        *)&__range1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>
            *)&__range1);
    __end1 = std::
             vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
             ::begin(&this->args);
    a = (unique_ptr<ArgNode,_std::default_delete<ArgNode>_> *)
        std::
        vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>
        ::end(&this->args);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
                                  *)&a);
      if (!bVar2) {
        pTVar5 = std::unique_ptr<TypeNode,_std::default_delete<TypeNode>_>::operator->
                           (&this->returnType);
        (*(pTVar5->super_ASTNode)._vptr_ASTNode[5])(pTVar5,local_18);
        pSVar9 = std::unique_ptr<SequenceNode,_std::default_delete<SequenceNode>_>::operator->
                           (&this->body);
        (*(pSVar9->super_ASTNode)._vptr_ASTNode[5])(pSVar9,local_18);
        std::
        vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
        ::pop_back(local_18);
        return;
      }
      local_278 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
                  ::operator*(&__end1);
      pvVar1 = local_18;
      pAVar6 = std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>::operator->(local_278);
      bVar2 = wasDeclared(pvVar1,&(pAVar6->super_VarNode).name);
      if (bVar2) break;
      pmVar4 = (map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
                *)std::
                  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>_>_>_>_>
                  ::back(local_18);
      pAVar6 = std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>::operator->(local_278);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c0,"var",&local_3c1);
      pAVar8 = std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>::operator->(local_278);
      pTVar5 = std::unique_ptr<TypeNode,_std::default_delete<TypeNode>_>::operator->(&pAVar8->type);
      std::__cxx11::string::string((string *)&local_3e8,(string *)&pTVar5->name);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_408,"local",&local_409);
      SymbolInfo::SymbolInfo(&local_3a0,&local_3c0,&local_3e8,&local_408);
      std::make_pair<std::__cxx11::string&,SymbolInfo>
                (&local_340,&(pAVar6->super_VarNode).name,&local_3a0);
      std::
      map<std::__cxx11::string,SymbolInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SymbolInfo>>>
      ::emplace<std::pair<std::__cxx11::string,SymbolInfo>>(pmVar4,&local_340);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolInfo>
      ::~pair(&local_340);
      SymbolInfo::~SymbolInfo(&local_3a0);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_*,_std::vector<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>,_std::allocator<std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>_>_>_>
      ::operator++(&__end1);
    }
    local_2b9 = 1;
    pSVar7 = (SemanticException *)__cxa_allocate_exception(0x10);
    pAVar6 = std::unique_ptr<ArgNode,_std::default_delete<ArgNode>_>::operator->(local_278);
    std::operator+(&local_2b8,"error: multiple definition of \'",&(pAVar6->super_VarNode).name);
    std::operator+(&local_298,&local_2b8,"\'");
    SemanticException::SemanticException(pSVar7,&local_298);
    local_2b9 = 0;
    __cxa_throw(pSVar7,&SemanticException::typeinfo,SemanticException::~SemanticException);
  }
  std::__cxx11::string::operator=(local_88,"local");
  local_c9 = 1;
  pSVar7 = (SemanticException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c8,"error: function \'",&this->name);
  std::operator+(&local_a8,&local_c8,"\' can only be declared in the global scope");
  SemanticException::SemanticException(pSVar7,&local_a8);
  local_c9 = 0;
  __cxa_throw(pSVar7,&SemanticException::typeinfo,SemanticException::~SemanticException);
}

Assistant:

void FuncDeclNode::check(std::vector<SymbolTable>& tables) {
    if (wasDeclared(tables, name)) {
        throw SemanticException("error: multiple definition of function '" + name + "'");
    } else {
        auto funcScope = std::string();
        if (tables.size() == 1) {
            funcScope = "global";
        } else {
            funcScope = "local"; // this is an error
            // TODO: Need to handle methods
            throw SemanticException("error: function '" + name + "' can only be declared in the global scope");
        }
        tables.back().emplace(std::make_pair(name, SymbolInfo("func", returnType->name, funcScope)));
//        std::cout << "new func added to table: named " << name << ", ret type: "
//                  << returnType->name << ", scope: " << funcScope << "\n";
    }

    // make a new scope for the args

    tables.push_back(SymbolTable());

    for (const auto& a : args) {
        if (wasDeclared(tables, a->name)) {
            throw SemanticException("error: multiple definition of '" + a->name + "'");
        } else {
            tables.back().emplace(std::make_pair(a->name, SymbolInfo("var", a->type->name, "local")));
//            std::cout << "\tnew var (arg) added to table: named " << a->name << ", type: "
//                      << a->type->name << ", scope: " << "local" << "\n";
        }
    }

    returnType->check(tables);
    body->check(tables);

    tables.pop_back();
}